

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O0

void vrna_seq_toRNA(char *sequence)

{
  uint local_14;
  uint i;
  char *sequence_local;
  
  if (sequence != (char *)0x0) {
    for (local_14 = 0; sequence[local_14] != '\0'; local_14 = local_14 + 1) {
      if (sequence[local_14] == 'T') {
        sequence[local_14] = 'U';
      }
      if (sequence[local_14] == 't') {
        sequence[local_14] = 'u';
      }
    }
  }
  return;
}

Assistant:

PUBLIC void
vrna_seq_toRNA(char *sequence)
{
  unsigned int i;

  if (sequence) {
    for (i = 0; sequence[i]; i++) {
      if (sequence[i] == 'T')
        sequence[i] = 'U';

      if (sequence[i] == 't')
        sequence[i] = 'u';
    }
  }
}